

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O1

void crnlib::console::remove_console_output_func(console_output_func pFunc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  void *pvVar5;
  mutex *this;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  init((EVP_PKEY_CTX *)pFunc);
  this = m_pMutex;
  mutex::lock(m_pMutex);
  uVar6 = DAT_001cf9d8 - 1;
  if (-1 < (int)uVar6) {
    lVar7 = (ulong)uVar6 * 0x10 + 0x10;
    iVar9 = -DAT_001cf9d8;
    uVar8 = (ulong)uVar6;
    uVar6 = DAT_001cf9d8;
    do {
      pvVar5 = m_output_funcs;
      if (*(console_output_func *)((long)m_output_funcs + uVar8 * 0x10) == pFunc) {
        if (uVar6 < DAT_001cf9d8 || uVar6 == DAT_001cf9d8) {
          if (uVar6 != DAT_001cf9d8) {
            uVar6 = DAT_001cf9d8 + iVar9;
            lVar10 = 0;
            do {
              puVar1 = (undefined8 *)((long)pvVar5 + lVar10 + lVar7);
              uVar4 = puVar1[1];
              puVar2 = (undefined8 *)((long)pvVar5 + lVar10 + lVar7 + -0x10);
              *puVar2 = *puVar1;
              puVar2[1] = uVar4;
              lVar10 = lVar10 + 0x10;
            } while ((ulong)uVar6 << 4 != lVar10);
          }
          DAT_001cf9d8 = DAT_001cf9d8 + -1;
        }
      }
      uVar6 = (uint)uVar8;
      lVar7 = lVar7 + -0x10;
      iVar9 = iVar9 + 1;
      bVar3 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  if ((DAT_001cf9d8 == 0) && (m_output_funcs != (void *)0x0)) {
    crnlib_free(m_output_funcs);
    m_output_funcs = (void *)0x0;
    _DAT_001cf9d8 = 0;
  }
  mutex::unlock(this);
  return;
}

Assistant:

void console::remove_console_output_func(console_output_func pFunc)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        for (int i = m_output_funcs.size() - 1; i >= 0; i--)
        {
            if (m_output_funcs[i].m_func == pFunc)
            {
                m_output_funcs.erase(m_output_funcs.begin() + i);
            }
        }

        if (!m_output_funcs.size())
        {
            m_output_funcs.clear();
        }
    }